

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

int ON_CompareDoubleArray(size_t count,double *a,double *b)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  double *pdVar6;
  bool bVar7;
  
  iVar3 = 0;
  if (a != b && count != 0) {
    if (a == (double *)0x0) {
      return 1;
    }
    if (b != (double *)0x0) {
      dVar1 = *a;
      dVar2 = *b;
      uVar4 = 0xffffffff;
      if ((dVar2 <= dVar1) && (uVar4 = 1, dVar1 <= dVar2)) {
        uVar4 = 0;
        if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) && (uVar4 = 0xffffffff, NAN(dVar1))) {
          uVar4 = (uint)!NAN(dVar2);
        }
      }
      if (1 < (long)count && uVar4 == 0) {
        pdVar5 = b + 1;
        pdVar6 = a + 2;
        do {
          dVar1 = pdVar6[-1];
          dVar2 = *pdVar5;
          uVar4 = 0xffffffff;
          if ((dVar2 <= dVar1) && (uVar4 = 1, dVar1 <= dVar2)) {
            uVar4 = 0;
            if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) && (uVar4 = 0xffffffff, NAN(dVar1))
               ) {
              uVar4 = (uint)!NAN(dVar2);
            }
          }
          if (uVar4 != 0) {
            return uVar4;
          }
          pdVar5 = pdVar5 + 1;
          bVar7 = pdVar6 < a + count;
          uVar4 = 0;
          pdVar6 = pdVar6 + 1;
        } while (bVar7);
      }
      return uVar4;
    }
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int ON_CompareDoubleArray(
  size_t count,
  const double* a,
  const double* b
  )
{
  if (count <= 0)
    return 0;
  if (a == b)
    return 0;
  if (nullptr == a)
    return 1;
  if (nullptr == b)
    return -1;
  return Internal_DoubleArrayCompare(count, a, b);
}